

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall tf::SmallVectorImpl<tf::Node_*>::~SmallVectorImpl(SmallVectorImpl<tf::Node_*> *this)

{
  bool bVar1;
  iterator ppNVar2;
  iterator ppNVar3;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RDI;
  
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
  ppNVar3 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  SmallVectorTemplateBase<tf::Node_*,_true>::destroy_range(ppNVar2,ppNVar3);
  bVar1 = SmallVectorTemplateCommon<tf::Node_*,_void>::isSmall(in_RDI);
  if (!bVar1) {
    ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::begin(in_RDI);
    free(ppNVar2);
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      std::free(this->begin());
  }